

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end,int server_preference)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  ptls_cipher_suite_t *ppVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = 0xffffffffffffffff;
  do {
    if (src == end) {
      if (uVar5 != 0xffffffffffffffff) {
        *selected = candidates[uVar5];
        return 0;
      }
      return 0x28;
    }
    iVar3 = 0x32;
    if ((long)end - (long)src < 2) {
LAB_00111c13:
      bVar2 = false;
      uVar6 = uVar5;
    }
    else {
      uVar1 = *(ushort *)src;
      src = (uint8_t *)((long)src + 2);
      iVar3 = 0;
      ppVar4 = *candidates;
      bVar2 = true;
      uVar6 = uVar5;
      if (ppVar4 != (ptls_cipher_suite_t *)0x0) {
        uVar7 = 0;
        do {
          if (ppVar4->id == (uint16_t)(uVar1 << 8 | uVar1 >> 8)) {
            if (server_preference == 0) {
              *selected = ppVar4;
              goto LAB_00111c13;
            }
            uVar6 = uVar7;
            if (uVar7 < uVar5) break;
          }
          ppVar4 = candidates[uVar7 + 1];
          uVar7 = uVar7 + 1;
          uVar6 = uVar5;
        } while (ppVar4 != (ptls_cipher_suite_t *)0x0);
      }
    }
    uVar5 = uVar6;
    if (!bVar2) {
      return iVar3;
    }
  } while( true );
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end, int server_preference)
{
    size_t found_index = SIZE_MAX;
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        for (size_t i = 0; candidates[i] != NULL; ++i) {
            if (candidates[i]->id == id) {
                if (server_preference) {
                    /* preserve smallest matching index, and proceed to the next input */
                    if (i < found_index) {
                        found_index = i;
                        break;
                    }
                } else {
                    /* return the pointer matching to the first input that can be used */
                    *selected = candidates[i];
                    goto Exit;
                }
            }
        }
    }
    if (found_index != SIZE_MAX) {
        *selected = candidates[found_index];
        ret = 0;
    } else {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
    }

Exit:
    return ret;
}